

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCapsuleShape.cpp
# Opt level: O3

void __thiscall
btCapsuleShapeZ::btCapsuleShapeZ(btCapsuleShapeZ *this,btScalar radius,btScalar height)

{
  btConvexInternalShape::btConvexInternalShape((btConvexInternalShape *)this);
  (this->super_btCapsuleShape).super_btConvexInternalShape.super_btConvexShape.
  super_btCollisionShape.m_shapeType = 10;
  (this->super_btCapsuleShape).super_btConvexInternalShape.super_btConvexShape.
  super_btCollisionShape._vptr_btCollisionShape = (_func_int **)&PTR__btConvexShape_0021d1c8;
  *(undefined4 *)&(this->super_btCapsuleShape).super_btConvexInternalShape.field_0x44 = 2;
  (this->super_btCapsuleShape).super_btConvexInternalShape.m_implicitShapeDimensions.m_floats[0] =
       radius;
  (this->super_btCapsuleShape).super_btConvexInternalShape.m_implicitShapeDimensions.m_floats[1] =
       radius;
  (this->super_btCapsuleShape).super_btConvexInternalShape.m_implicitShapeDimensions.m_floats[2] =
       height * 0.5;
  (this->super_btCapsuleShape).super_btConvexInternalShape.m_implicitShapeDimensions.m_floats[3] =
       0.0;
  return;
}

Assistant:

btCapsuleShapeZ::btCapsuleShapeZ(btScalar radius,btScalar height)
{
	m_upAxis = 2;
	m_implicitShapeDimensions.setValue(radius,radius,0.5f*height);
}